

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::NameResolvesToFramework(cmGlobalGenerator *this,string *libname)

{
  bool bVar1;
  cmTarget *this_00;
  cmTarget *tgt;
  string *libname_local;
  cmGlobalGenerator *this_local;
  
  bVar1 = cmSystemTools::IsPathToFramework(libname);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = FindTarget(this,libname,false);
    if ((this_00 == (cmTarget *)0x0) || (bVar1 = cmTarget::IsFrameworkOnApple(this_00), !bVar1)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::NameResolvesToFramework(
  const std::string& libname) const
{
  if (cmSystemTools::IsPathToFramework(libname)) {
    return true;
  }

  if (cmTarget* tgt = this->FindTarget(libname)) {
    if (tgt->IsFrameworkOnApple()) {
      return true;
    }
  }

  return false;
}